

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterTestGroup::init
          (AtomicCounterTestGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  uint activeStagesMask;
  TestNode *pTVar2;
  AtomicCounterReferencedByCase *pAVar3;
  ulong extraout_RAX;
  char *pcVar4;
  ulong uVar5;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string name;
  char *stageName;
  uint local_88;
  deUint32 currentBit;
  deUint32 stageNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint local_20;
  int pipelineNdx;
  AtomicCounterTestGroup *local_10;
  AtomicCounterTestGroup *this_local;
  
  local_10 = this;
  pTVar2 = (TestNode *)operator_new(0x80);
  AtomicCounterResourceListCase::AtomicCounterResourceListCase
            ((AtomicCounterResourceListCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "resource_list","Resource list");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  AtomicCounterActiveVariablesCase::AtomicCounterActiveVariablesCase
            ((AtomicCounterActiveVariablesCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "active_variables","Active variables");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  AtomicCounterBufferBindingCase::AtomicCounterBufferBindingCase
            ((AtomicCounterBufferBindingCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "buffer_binding","Buffer binding");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  AtomicCounterBufferDataSizeCase::AtomicCounterBufferDataSizeCase
            ((AtomicCounterBufferDataSizeCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "buffer_data_size","Buffer binding");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pAVar3 = (AtomicCounterReferencedByCase *)operator_new(0x90);
  AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
            (pAVar3,(this->super_TestCaseGroup).m_context,"referenced_by_compute","",false,0x20,0x20
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (AtomicCounterReferencedByCase *)operator_new(0x90);
  AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
            (pAVar3,(this->super_TestCaseGroup).m_context,"referenced_by_separable_vertex","",true,1
             ,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (AtomicCounterReferencedByCase *)operator_new(0x90);
  AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
            (pAVar3,(this->super_TestCaseGroup).m_context,"referenced_by_separable_fragment","",true
             ,2,2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (AtomicCounterReferencedByCase *)operator_new(0x90);
  AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
            (pAVar3,(this->super_TestCaseGroup).m_context,"referenced_by_separable_geometry","",true
             ,4,4);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (AtomicCounterReferencedByCase *)operator_new(0x90);
  AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
            (pAVar3,(this->super_TestCaseGroup).m_context,"referenced_by_separable_tess_ctrl","",
             true,8,8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  pAVar3 = (AtomicCounterReferencedByCase *)operator_new(0x90);
  AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
            (pAVar3,(this->super_TestCaseGroup).m_context,"referenced_by_separable_tess_eval","",
             true,0x10,0x10);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  local_20 = 0;
  uVar5 = extraout_RAX;
  while ((int)local_20 < 4) {
    pAVar3 = (AtomicCounterReferencedByCase *)operator_new(0x90);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string((string *)&stageNdx);
    std::operator+(&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stageNdx,
                   "referenced_by_");
    std::operator+(&local_40,&local_60,init::pipelines[(int)local_20].name);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
              (pAVar3,pCVar1,pcVar4,"",false,init::pipelines[(int)local_20].flags,
               init::pipelines[(int)local_20].flags);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&stageNdx);
    for (local_88 = 0;
        (local_88 < 6 &&
        (activeStagesMask = 1 << ((byte)local_88 & 0x1f),
        activeStagesMask <= init::pipelines[(int)local_20].flags)); local_88 = local_88 + 1) {
      if ((activeStagesMask & init::pipelines[(int)local_20].flags) != 0) {
        if (local_88 == 0) {
          local_1b0 = "vertex";
        }
        else {
          if (local_88 == 1) {
            local_1b8 = "fragment";
          }
          else {
            if (local_88 == 2) {
              local_1c0 = "geo";
            }
            else {
              if (local_88 == 3) {
                local_1c8 = "tess_ctrl";
              }
              else {
                local_1c8 = (char *)0x0;
                if (local_88 == 4) {
                  local_1c8 = "tess_eval";
                }
              }
              local_1c0 = local_1c8;
            }
            local_1b8 = local_1c0;
          }
          local_1b0 = local_1b8;
        }
        name.field_2._8_8_ = local_1b0;
        std::__cxx11::string::string((string *)&local_138);
        std::operator+(&local_118,&local_138,"referenced_by_");
        std::operator+(&local_f8,&local_118,init::pipelines[(int)local_20].name);
        std::operator+(&local_d8,&local_f8,"_only_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,&local_d8,(char *)name.field_2._8_8_);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_138);
        pAVar3 = (AtomicCounterReferencedByCase *)operator_new(0x90);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
                  (pAVar3,pCVar1,pcVar4,"",false,init::pipelines[(int)local_20].flags,
                   activeStagesMask);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
        std::__cxx11::string::~string((string *)local_b8);
      }
    }
    local_20 = local_20 + 1;
    uVar5 = (ulong)local_20;
  }
  return (int)uVar5;
}

Assistant:

void AtomicCounterTestGroup::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	flags;
	} pipelines[] =
	{
		{
			"vertex_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT)
		},
		{
			"vertex_tess_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION)
		},
		{
			"vertex_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_GEOMETRY)
		},
		{
			"vertex_tess_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION) | (1 << glu::SHADERTYPE_GEOMETRY),
		},
	};

	// .resource_list
	addChild(new AtomicCounterResourceListCase(m_context, "resource_list", "Resource list"));

	// .active_variables
	addChild(new AtomicCounterActiveVariablesCase(m_context, "active_variables", "Active variables"));

	// .buffer_binding
	addChild(new AtomicCounterBufferBindingCase(m_context, "buffer_binding", "Buffer binding"));

	// .buffer_data_size
	addChild(new AtomicCounterBufferDataSizeCase(m_context, "buffer_data_size", "Buffer binding"));

	// .referenced_by
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_compute",				"",	false,	(1 << glu::SHADERTYPE_COMPUTE),										(1 << glu::SHADERTYPE_COMPUTE)));
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_separable_vertex",		"",	true,	(1 << glu::SHADERTYPE_VERTEX),										(1 << glu::SHADERTYPE_VERTEX)));
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_separable_fragment",	"",	true,	(1 << glu::SHADERTYPE_FRAGMENT),									(1 << glu::SHADERTYPE_FRAGMENT)));
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_separable_geometry",	"",	true,	(1 << glu::SHADERTYPE_GEOMETRY),									(1 << glu::SHADERTYPE_GEOMETRY)));
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_separable_tess_ctrl",	"",	true,	(1 << glu::SHADERTYPE_TESSELLATION_CONTROL),						(1 << glu::SHADERTYPE_TESSELLATION_CONTROL)));
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_separable_tess_eval",	"",	true,	(1 << glu::SHADERTYPE_TESSELLATION_EVALUATION),						(1 << glu::SHADERTYPE_TESSELLATION_EVALUATION)));

	for (int pipelineNdx = 0; pipelineNdx < DE_LENGTH_OF_ARRAY(pipelines); ++pipelineNdx)
	{
		addChild(new AtomicCounterReferencedByCase(m_context, (std::string() + "referenced_by_" + pipelines[pipelineNdx].name).c_str(), "", false, pipelines[pipelineNdx].flags, pipelines[pipelineNdx].flags));

		for (deUint32 stageNdx = 0; stageNdx < glu::SHADERTYPE_LAST; ++stageNdx)
		{
			const deUint32 currentBit = (1u << stageNdx);
			if (currentBit > pipelines[pipelineNdx].flags)
				break;
			if (currentBit & pipelines[pipelineNdx].flags)
			{
				const char*			stageName	= (stageNdx == glu::SHADERTYPE_VERTEX)					? ("vertex")
												: (stageNdx == glu::SHADERTYPE_FRAGMENT)				? ("fragment")
												: (stageNdx == glu::SHADERTYPE_GEOMETRY)				? ("geo")
												: (stageNdx == glu::SHADERTYPE_TESSELLATION_CONTROL)	? ("tess_ctrl")
												: (stageNdx == glu::SHADERTYPE_TESSELLATION_EVALUATION)	? ("tess_eval")
												: (DE_NULL);
				const std::string	name		= std::string() + "referenced_by_" + pipelines[pipelineNdx].name + "_only_" + stageName;

				addChild(new AtomicCounterReferencedByCase(m_context, name.c_str(), "", false, pipelines[pipelineNdx].flags, currentBit));
			}
		}
	}
}